

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O0

void inimenu(void)

{
  bool bVar1;
  long *plVar2;
  int local_3d4;
  int local_3d0;
  int j;
  int i;
  long local_3c0;
  stringstream ss;
  ostream local_3b0 [376];
  string local_238 [8];
  string s;
  char local_212;
  char local_211;
  char local_210 [6];
  char b;
  char a;
  ifstream fin;
  
  std::ifstream::ifstream(local_210,"menu.txt",8);
  std::__cxx11::string::string(local_238);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_3c0);
  local_3d0 = 0;
  do {
    if (4 < local_3d0) {
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_3c0);
      std::__cxx11::string::~string(local_238);
      std::ifstream::~ifstream(local_210);
      return;
    }
    local_3d4 = 0;
    std::__cxx11::string::erase((ulong)local_238,0);
    while( true ) {
      plVar2 = (long *)std::istream::get(local_210);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
      if (!bVar1) break;
      if ((((local_211 < 'a') || ('z' < local_211)) && ((local_211 < 'A' || ('Z' < local_211)))) &&
         ((local_211 < '0' || ('9' < local_211)))) {
        if ((local_211 == ' ') || (local_211 == '\n')) {
          switch(local_3d4) {
          case 0:
            std::__cxx11::string::operator=((string *)(ITEM + local_3d0),local_238);
            break;
          case 1:
            ITEM[local_3d0].price = (double)(local_212 + -0x30);
            break;
          case 2:
            std::operator<<(local_3b0,local_238);
            std::istream::operator>>((istream *)&local_3c0,&ITEM[local_3d0].amount);
            break;
          case 3:
            std::operator<<(local_3b0,local_238);
            std::istream::operator>>((istream *)&local_3c0,&ITEM[local_3d0].manu);
            break;
          case 4:
            std::operator<<(local_3b0,local_238);
            std::istream::operator>>((istream *)&local_3c0,&ITEM[local_3d0].span);
          }
          local_3d4 = local_3d4 + 1;
          if (4 < local_3d4) break;
          std::__cxx11::string::erase((ulong)local_238,0);
          std::ios::clear((long)&local_3c0 + *(long *)(local_3c0 + -0x18),0);
        }
      }
      else {
        std::__cxx11::string::operator+=(local_238,local_211);
        local_212 = local_211;
      }
    }
    local_3d0 = local_3d0 + 1;
  } while( true );
}

Assistant:

void inimenu() {
    ifstream fin("menu.txt");
    char a, b;
    string s;
    stringstream ss;
    int i, j;

    for (i = 0; i < number; i++) {
        j = 0;
        s.erase(0);
        while (fin.get(a)) {
            if ((a >= 'a' && a <= 'z') || (a >= 'A' && a <= 'Z') || (a >= '0' && a <= '9')) {
                s += a;
                b = a;
            } else if (a == ' ' || a == '\n') {
                switch (j) {
                    case 0:
                        ITEM[i].name = s;
                        break;
                    case 1:
                        ITEM[i].price = b - '0';
                        break;
                    case 2:
                        ss << s;
                        ss >> ITEM[i].amount;
                        break;
                    case 3:
                        ss << s;
                        ss >> ITEM[i].manu;
                        break;
                    case 4:
                        ss << s;
                        ss >> ITEM[i].span;
                }
                j++;
                if (j > 4) {
                    break;
                }

                s.erase(0);
                ss.clear();
            }
        }
    }
    fin.close();
}